

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O1

VkDescriptorSetLayout __thiscall
vkt::image::anon_unknown_0::ImageStoreTestInstance::prepareDescriptors(ImageStoreTestInstance *this)

{
  Move<vk::Handle<(vk::HandleType)19>_> *pMVar1;
  int *piVar2;
  deInt32 *pdVar3;
  uint numDescriptors;
  VkDescriptorSetLayout obj;
  VkDescriptorPool obj_00;
  pointer pSVar4;
  long *plVar5;
  VkImage VVar6;
  pointer pSVar7;
  SharedPtrStateBase *pSVar8;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  ImageType imageType;
  VkImageViewType VVar9;
  DeviceInterface *vk;
  VkDevice device;
  DescriptorSetLayoutBuilder *pDVar10;
  DescriptorPoolBuilder *pDVar11;
  deUint64 *pdVar12;
  long *plVar13;
  Unique<vk::Handle<(vk::HandleType)22>_> *pUVar14;
  SharedPtrStateBase *pSVar15;
  Unique<vk::Handle<(vk::HandleType)13>_> *pUVar16;
  long lVar17;
  ulong uVar18;
  VkImageSubresourceRange res;
  VkImageSubresourceRange res_1;
  Move<vk::Handle<(vk::HandleType)19>_> local_188;
  Move<vk::Handle<(vk::HandleType)21>_> local_168;
  Move<vk::Handle<(vk::HandleType)22>_> local_148;
  Move<vk::Handle<(vk::HandleType)22>_> local_128;
  Move<vk::Handle<(vk::HandleType)21>_> *local_100;
  Move<vk::Handle<(vk::HandleType)13>_> local_f8;
  Move<vk::Handle<(vk::HandleType)13>_> local_d8;
  ulong local_b8;
  undefined8 local_b0;
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  undefined4 local_a0;
  DescriptorSetLayoutBuilder local_98;
  undefined8 local_48;
  undefined8 uStack_40;
  uint local_38;
  
  vk = Context::getDeviceInterface
                 ((this->super_StoreTestInstance).super_BaseTestInstance.super_TestInstance.
                  m_context);
  device = Context::getDevice((this->super_StoreTestInstance).super_BaseTestInstance.
                              super_TestInstance.m_context);
  numDescriptors = (this->super_StoreTestInstance).super_BaseTestInstance.m_texture.m_numLayers;
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder(&local_98);
  pDVar10 = ::vk::DescriptorSetLayoutBuilder::addBinding
                      (&local_98,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,1,0x20,(VkSampler *)0x0);
  pDVar10 = ::vk::DescriptorSetLayoutBuilder::addBinding
                      (pDVar10,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,1,0x20,(VkSampler *)0x0);
  ::vk::DescriptorSetLayoutBuilder::build(&local_188,pDVar10,vk,device,0);
  local_168.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device =
       local_188.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_device;
  local_168.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator =
       local_188.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator;
  local_168.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal =
       local_188.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal;
  local_168.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface =
       local_188.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_deviceIface;
  local_188.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal = 0;
  local_188.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_188.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_188.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  obj.m_internal =
       (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.
       m_internal;
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
              (&(this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.
                deleter,obj);
  }
  pMVar1 = &this->m_descriptorSetLayout;
  (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
  m_device = local_168.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device;
  (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
  m_allocator = local_168.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator;
  (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.m_internal =
       local_168.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal;
  (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
  m_deviceIface =
       local_168.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface;
  if (local_188.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
              (&local_188.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter,
               (VkDescriptorSetLayout)
               local_188.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal);
  }
  local_188.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_188.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  local_188.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal = 0;
  local_188.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  if (local_98.m_immutableSamplers.
      super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.m_immutableSamplers.
                    super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.m_immutableSamplers.
                          super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.m_immutableSamplers.
                          super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_98.m_immutableSamplerInfos.
      super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.m_immutableSamplerInfos.
                    super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.m_immutableSamplerInfos.
                          super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.m_immutableSamplerInfos.
                          super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_98.m_bindings.
      super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.m_bindings.
                    super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.m_bindings.
                          super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.m_bindings.
                          super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&local_188);
  pDVar11 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&local_188,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,
                       numDescriptors);
  pDVar11 = ::vk::DescriptorPoolBuilder::addType
                      (pDVar11,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,numDescriptors);
  ::vk::DescriptorPoolBuilder::build(&local_168,pDVar11,vk,device,1,numDescriptors);
  local_98.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_168.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device;
  local_98.m_immutableSamplerInfos.
  super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)local_168.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator;
  local_98.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)local_168.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal;
  local_98.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)local_168.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
                m_deviceIface;
  local_168.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal = 0;
  local_168.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_168.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_168.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  obj_00.m_internal =
       (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.
       m_internal;
  if (obj_00.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
              (&(this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.
                deleter,obj_00);
  }
  local_100 = &this->m_descriptorPool;
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device =
       (VkDevice)
       local_98.m_bindings.
       super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator
       = (VkAllocationCallbacks *)
         local_98.m_immutableSamplerInfos.
         super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
         ._M_impl.super__Vector_impl_data._M_start;
  (local_100->super_RefBase<vk::Handle<(vk::HandleType)21>_>).m_data.object.m_internal =
       (deUint64)
       local_98.m_bindings.
       super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
  m_deviceIface =
       (DeviceInterface *)
       local_98.m_bindings.
       super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (local_168.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
              (&local_168.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter,
               (VkDescriptorPool)
               local_168.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal);
  }
  local_168.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_168.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  local_168.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal = 0;
  local_168.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  if ((void *)local_188.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal !=
      (void *)0x0) {
    operator_delete((void *)local_188.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.
                            m_internal,
                    (long)local_188.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
                          m_device -
                    local_188.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.
                    m_internal);
  }
  if ((this->super_StoreTestInstance).super_BaseTestInstance.m_singleLayerBind == true) {
    if (0 < (int)numDescriptors) {
      lVar17 = 8;
      uVar18 = 0;
      local_b8 = (ulong)numDescriptors;
      do {
        makeDescriptorSet(&local_128,vk,device,
                          (VkDescriptorPool)
                          (local_100->super_RefBase<vk::Handle<(vk::HandleType)21>_>).m_data.object.
                          m_internal,
                          (VkDescriptorSetLayout)
                          (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.
                          m_internal);
        pdVar12 = (deUint64 *)operator_new(0x20);
        pdVar12[2] = (deUint64)
                     local_128.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
                     m_device;
        pdVar12[3] = local_128.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
                     m_internal;
        *pdVar12 = local_128.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal
        ;
        pdVar12[1] = (deUint64)
                     local_128.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
                     m_deviceIface;
        local_128.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal = 0;
        local_128.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface =
             (DeviceInterface *)0x0;
        local_128.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device =
             (VkDevice)0x0;
        local_128.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.m_internal =
             0;
        plVar13 = (long *)operator_new(0x20);
        *(undefined4 *)(plVar13 + 1) = 0;
        *(undefined4 *)((long)plVar13 + 0xc) = 0;
        *plVar13 = (long)&PTR__SharedPtrState_00d1e1d0;
        plVar13[2] = (long)pdVar12;
        *(undefined4 *)(plVar13 + 1) = 1;
        *(undefined4 *)((long)plVar13 + 0xc) = 1;
        pSVar4 = (this->m_allDescriptorSets).
                 super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        plVar5 = *(long **)((long)&pSVar4->m_ptr + lVar17);
        if (plVar5 != plVar13) {
          if (plVar5 != (long *)0x0) {
            LOCK();
            plVar5 = plVar5 + 1;
            *(int *)plVar5 = (int)*plVar5 + -1;
            UNLOCK();
            if ((int)*plVar5 == 0) {
              *(undefined8 *)((long)pSVar4 + lVar17 + -8) = 0;
              (**(code **)(**(long **)((long)&pSVar4->m_ptr + lVar17) + 0x10))();
            }
            LOCK();
            piVar2 = (int *)(*(long *)((long)&pSVar4->m_ptr + lVar17) + 0xc);
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              plVar5 = *(long **)((long)&pSVar4->m_ptr + lVar17);
              if (plVar5 != (long *)0x0) {
                (**(code **)(*plVar5 + 8))();
              }
              *(undefined8 *)((long)&pSVar4->m_ptr + lVar17) = 0;
            }
          }
          *(deUint64 **)((long)pSVar4 + lVar17 + -8) = pdVar12;
          *(long **)((long)&pSVar4->m_ptr + lVar17) = plVar13;
          LOCK();
          *(int *)(plVar13 + 1) = (int)plVar13[1] + 1;
          UNLOCK();
          LOCK();
          piVar2 = (int *)(*(long *)((long)&pSVar4->m_ptr + lVar17) + 0xc);
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        LOCK();
        plVar5 = plVar13 + 1;
        *(int *)plVar5 = (int)*plVar5 + -1;
        UNLOCK();
        if ((int)*plVar5 == 0) {
          (**(code **)(*plVar13 + 0x10))(plVar13);
        }
        LOCK();
        piVar2 = (int *)((long)plVar13 + 0xc);
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          (**(code **)(*plVar13 + 8))(plVar13);
        }
        if ((pointer)local_128.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.
                     m_internal != (pointer)0x0) {
          local_98.m_bindings.
          super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)local_128.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.
                        m_internal;
          (*(local_128.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface)
            ->_vptr_DeviceInterface[0x3d])
                    (local_128.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
                     m_deviceIface,
                     local_128.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
                     m_device,local_128.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.
                              deleter.m_pool.m_internal,1,&local_98);
        }
        local_128.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device =
             (VkDevice)0x0;
        local_128.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.m_internal =
             0;
        local_128.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal = 0;
        local_128.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface =
             (DeviceInterface *)0x0;
        VVar6.m_internal =
             (((this->m_image).
               super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>.m_data.
              ptr)->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
        imageType = getImageTypeForSingleLayer
                              ((this->super_StoreTestInstance).super_BaseTestInstance.m_texture.
                               m_type);
        VVar9 = mapImageViewType(imageType);
        local_b0 = 1;
        uStack_a8 = 1;
        uStack_a4 = (undefined4)uVar18;
        local_a0 = 1;
        subresourceRange.baseArrayLayer = uStack_a4;
        subresourceRange.levelCount = 1;
        subresourceRange.aspectMask = 1;
        subresourceRange.baseMipLevel = 0;
        subresourceRange.layerCount = 1;
        makeImageView(&local_d8,vk,device,VVar6,VVar9,
                      (this->super_StoreTestInstance).super_BaseTestInstance.m_format,
                      subresourceRange);
        pdVar12 = (deUint64 *)operator_new(0x20);
        pdVar12[2] = (deUint64)
                     local_d8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device
        ;
        pdVar12[3] = (deUint64)
                     local_d8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
                     m_allocator;
        *pdVar12 = local_d8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
        pdVar12[1] = (deUint64)
                     local_d8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
                     m_deviceIface;
        local_d8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
        local_d8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
             (DeviceInterface *)0x0;
        local_d8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
             (VkDevice)0x0;
        local_d8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
             (VkAllocationCallbacks *)0x0;
        plVar13 = (long *)operator_new(0x20);
        *(undefined4 *)(plVar13 + 1) = 0;
        *(undefined4 *)((long)plVar13 + 0xc) = 0;
        *plVar13 = (long)&PTR__SharedPtrState_00d1de90;
        plVar13[2] = (long)pdVar12;
        *(undefined4 *)(plVar13 + 1) = 1;
        *(undefined4 *)((long)plVar13 + 0xc) = 1;
        pSVar7 = (this->m_allImageViews).
                 super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        plVar5 = *(long **)((long)&pSVar7->m_ptr + lVar17);
        if (plVar5 != plVar13) {
          if (plVar5 != (long *)0x0) {
            LOCK();
            plVar5 = plVar5 + 1;
            *(int *)plVar5 = (int)*plVar5 + -1;
            UNLOCK();
            if ((int)*plVar5 == 0) {
              *(undefined8 *)((long)pSVar7 + lVar17 + -8) = 0;
              (**(code **)(**(long **)((long)&pSVar7->m_ptr + lVar17) + 0x10))();
            }
            LOCK();
            piVar2 = (int *)(*(long *)((long)&pSVar7->m_ptr + lVar17) + 0xc);
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              plVar5 = *(long **)((long)&pSVar7->m_ptr + lVar17);
              if (plVar5 != (long *)0x0) {
                (**(code **)(*plVar5 + 8))();
              }
              *(undefined8 *)((long)&pSVar7->m_ptr + lVar17) = 0;
            }
          }
          *(deUint64 **)((long)pSVar7 + lVar17 + -8) = pdVar12;
          *(long **)((long)&pSVar7->m_ptr + lVar17) = plVar13;
          LOCK();
          *(int *)(plVar13 + 1) = (int)plVar13[1] + 1;
          UNLOCK();
          LOCK();
          piVar2 = (int *)(*(long *)((long)&pSVar7->m_ptr + lVar17) + 0xc);
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        LOCK();
        plVar5 = plVar13 + 1;
        *(int *)plVar5 = (int)*plVar5 + -1;
        UNLOCK();
        if ((int)*plVar5 == 0) {
          (**(code **)(*plVar13 + 0x10))(plVar13);
        }
        LOCK();
        piVar2 = (int *)((long)plVar13 + 0xc);
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          (**(code **)(*plVar13 + 8))(plVar13);
        }
        if (local_d8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal != 0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                    (&local_d8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
                     (VkImageView)
                     local_d8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
                     m_internal);
        }
        local_d8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
             (VkDevice)0x0;
        local_d8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
             (VkAllocationCallbacks *)0x0;
        local_d8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
        local_d8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
             (DeviceInterface *)0x0;
        uVar18 = uVar18 + 1;
        lVar17 = lVar17 + 0x10;
      } while (local_b8 != uVar18);
    }
  }
  else {
    makeDescriptorSet(&local_148,vk,device,
                      (VkDescriptorPool)
                      (local_100->super_RefBase<vk::Handle<(vk::HandleType)21>_>).m_data.object.
                      m_internal,
                      (VkDescriptorSetLayout)
                      (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.
                      m_internal);
    pUVar14 = (Unique<vk::Handle<(vk::HandleType)22>_> *)operator_new(0x20);
    (pUVar14->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.deleter.m_device =
         local_148.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device;
    (pUVar14->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.deleter.m_pool.m_internal =
         local_148.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.m_internal;
    *(deUint64 *)&(pUVar14->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data =
         local_148.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal;
    (pUVar14->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.deleter.m_deviceIface =
         local_148.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface;
    local_148.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal = 0;
    local_148.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    local_148.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device = (VkDevice)0x0
    ;
    local_148.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.m_internal = 0;
    pSVar15 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar15->strongRefCount = 0;
    pSVar15->weakRefCount = 0;
    pSVar15->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00d1e1d0;
    pSVar15[1]._vptr_SharedPtrStateBase = (_func_int **)pUVar14;
    pSVar15->strongRefCount = 1;
    pSVar15->weakRefCount = 1;
    pSVar4 = (this->m_allDescriptorSets).
             super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar8 = pSVar4->m_state;
    if (pSVar8 != pSVar15) {
      if (pSVar8 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar3 = &pSVar8->strongRefCount;
        *pdVar3 = *pdVar3 + -1;
        UNLOCK();
        if (*pdVar3 == 0) {
          pSVar4->m_ptr = (Unique<vk::Handle<(vk::HandleType)22>_> *)0x0;
          (*pSVar4->m_state->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar3 = &pSVar4->m_state->weakRefCount;
        *pdVar3 = *pdVar3 + -1;
        UNLOCK();
        if (*pdVar3 == 0) {
          if (pSVar4->m_state != (SharedPtrStateBase *)0x0) {
            (*pSVar4->m_state->_vptr_SharedPtrStateBase[1])();
          }
          pSVar4->m_state = (SharedPtrStateBase *)0x0;
        }
      }
      pSVar4->m_ptr = pUVar14;
      pSVar4->m_state = pSVar15;
      LOCK();
      pSVar15->strongRefCount = pSVar15->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar3 = &pSVar4->m_state->weakRefCount;
      *pdVar3 = *pdVar3 + 1;
      UNLOCK();
    }
    LOCK();
    pdVar3 = &pSVar15->strongRefCount;
    *pdVar3 = *pdVar3 + -1;
    UNLOCK();
    if (*pdVar3 == 0) {
      (*pSVar15->_vptr_SharedPtrStateBase[2])(pSVar15);
    }
    LOCK();
    pdVar3 = &pSVar15->weakRefCount;
    *pdVar3 = *pdVar3 + -1;
    UNLOCK();
    if (*pdVar3 == 0) {
      (*pSVar15->_vptr_SharedPtrStateBase[1])(pSVar15);
    }
    if ((pointer)local_148.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal
        != (pointer)0x0) {
      local_98.m_bindings.
      super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)local_148.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.
                    m_internal;
      (*(local_148.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface)->
        _vptr_DeviceInterface[0x3d])
                (local_148.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
                 m_deviceIface,
                 local_148.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device,
                 local_148.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
                 m_internal,1);
    }
    local_148.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device = (VkDevice)0x0
    ;
    local_148.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.m_internal = 0;
    local_148.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal = 0;
    local_148.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    VVar6.m_internal =
         (((this->m_image).
           super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>.m_data.ptr)->
         m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
    VVar9 = mapImageViewType((this->super_StoreTestInstance).super_BaseTestInstance.m_texture.m_type
                            );
    local_48 = 1;
    uStack_40 = 1;
    subresourceRange_00.levelCount = 1;
    subresourceRange_00.baseArrayLayer = 0;
    subresourceRange_00.aspectMask = 1;
    subresourceRange_00.baseMipLevel = 0;
    subresourceRange_00.layerCount = numDescriptors;
    local_38 = numDescriptors;
    makeImageView(&local_f8,vk,device,VVar6,VVar9,
                  (this->super_StoreTestInstance).super_BaseTestInstance.m_format,
                  subresourceRange_00);
    pUVar16 = (Unique<vk::Handle<(vk::HandleType)13>_> *)operator_new(0x20);
    (pUVar16->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_device =
         local_f8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
    (pUVar16->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_allocator =
         local_f8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
    *(deUint64 *)&(pUVar16->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data =
         local_f8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
    (pUVar16->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_deviceIface =
         local_f8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface;
    local_f8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
    local_f8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    local_f8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device = (VkDevice)0x0;
    local_f8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    pSVar15 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar15->strongRefCount = 0;
    pSVar15->weakRefCount = 0;
    pSVar15->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00d1de90;
    pSVar15[1]._vptr_SharedPtrStateBase = (_func_int **)pUVar16;
    pSVar15->strongRefCount = 1;
    pSVar15->weakRefCount = 1;
    pSVar7 = (this->m_allImageViews).
             super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar8 = pSVar7->m_state;
    if (pSVar8 != pSVar15) {
      if (pSVar8 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar3 = &pSVar8->strongRefCount;
        *pdVar3 = *pdVar3 + -1;
        UNLOCK();
        if (*pdVar3 == 0) {
          pSVar7->m_ptr = (Unique<vk::Handle<(vk::HandleType)13>_> *)0x0;
          (*pSVar7->m_state->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar3 = &pSVar7->m_state->weakRefCount;
        *pdVar3 = *pdVar3 + -1;
        UNLOCK();
        if (*pdVar3 == 0) {
          if (pSVar7->m_state != (SharedPtrStateBase *)0x0) {
            (*pSVar7->m_state->_vptr_SharedPtrStateBase[1])();
          }
          pSVar7->m_state = (SharedPtrStateBase *)0x0;
        }
      }
      pSVar7->m_ptr = pUVar16;
      pSVar7->m_state = pSVar15;
      LOCK();
      pSVar15->strongRefCount = pSVar15->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar3 = &pSVar7->m_state->weakRefCount;
      *pdVar3 = *pdVar3 + 1;
      UNLOCK();
    }
    LOCK();
    pdVar3 = &pSVar15->strongRefCount;
    *pdVar3 = *pdVar3 + -1;
    UNLOCK();
    if (*pdVar3 == 0) {
      (*pSVar15->_vptr_SharedPtrStateBase[2])(pSVar15);
    }
    LOCK();
    pdVar3 = &pSVar15->weakRefCount;
    *pdVar3 = *pdVar3 + -1;
    UNLOCK();
    if (*pdVar3 == 0) {
      (*pSVar15->_vptr_SharedPtrStateBase[1])(pSVar15);
    }
    if (local_f8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                (&local_f8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
                 (VkImageView)
                 local_f8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal);
    }
  }
  return (VkDescriptorSetLayout)
         (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.m_internal;
}

Assistant:

VkDescriptorSetLayout ImageStoreTestInstance::prepareDescriptors (void)
{
	const DeviceInterface&	vk		= m_context.getDeviceInterface();
	const VkDevice			device	= m_context.getDevice();

	const int numLayers = m_texture.numLayers();
	m_descriptorSetLayout = DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, VK_SHADER_STAGE_COMPUTE_BIT)
		.addSingleBinding(VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
		.build(vk, device);

	m_descriptorPool = DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, numLayers)
		.addType(VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, numLayers)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, numLayers);

	if (m_singleLayerBind)
	{
		for (int layerNdx = 0; layerNdx < numLayers; ++layerNdx)
		{
			m_allDescriptorSets[layerNdx] = makeVkSharedPtr(makeDescriptorSet(vk, device, *m_descriptorPool, *m_descriptorSetLayout));
			m_allImageViews[layerNdx]     = makeVkSharedPtr(makeImageView(
												vk, device, m_image->get(), mapImageViewType(getImageTypeForSingleLayer(m_texture.type())), m_format,
												makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, layerNdx, 1u)));
		}
	}
	else // bind all layers at once
	{
		m_allDescriptorSets[0] = makeVkSharedPtr(makeDescriptorSet(vk, device, *m_descriptorPool, *m_descriptorSetLayout));
		m_allImageViews[0] = makeVkSharedPtr(makeImageView(
								vk, device, m_image->get(), mapImageViewType(m_texture.type()), m_format,
								makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, numLayers)));
	}

	return *m_descriptorSetLayout;  // not passing the ownership
}